

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall SyncScanner::isHeaderPCH(SyncScanner *this,string *headerFilename)

{
  int iVar1;
  size_type sVar2;
  
  if (isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_);
    if (iVar1 != 0) {
      isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_._M_dataplus._M_p =
           (pointer)&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_,"_pch.h",
                 "");
      __cxa_atexit(std::__cxx11::string::~string,
                   &isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_);
    }
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (headerFilename,
                     isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_._M_dataplus._M_p
                     ,headerFilename->_M_string_length -
                      isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_.
                      _M_string_length,
                     isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_._M_string_length
                    );
  return sVar2 != 0xffffffffffffffff;
}

Assistant:

[[nodiscard]] bool isHeaderPCH(const std::string &headerFilename)
    {
        static const std::string pchSuffix("_pch.h");
        return headerFilename.find(pchSuffix, headerFilename.size() - pchSuffix.size())
                != std::string::npos;
    }